

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O0

void __thiscall
CoinSelection_SelectCoins_Simple_Error_utxos_empty_Test::
~CoinSelection_SelectCoins_Simple_Error_utxos_empty_Test
          (CoinSelection_SelectCoins_Simple_Error_utxos_empty_Test *this)

{
  void *in_RDI;
  
  ~CoinSelection_SelectCoins_Simple_Error_utxos_empty_Test
            ((CoinSelection_SelectCoins_Simple_Error_utxos_empty_Test *)0x27f018);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_Simple_Error_utxos_empty)
{
  Amount target_amount = Amount::CreateBySatoshiAmount(100000000);
  Amount select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  bool use_bnb = false;
  EXPECT_THROW(std::vector<Utxo> ret = exp_selection.SelectCoins(
      target_amount, std::vector<Utxo>(), exp_filter, GetBitcoinOption(),
      tx_fee, &select_value, &fee, &use_bnb), CfdException);
}